

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateCheckTermination_Test::TestBody
          (OsqpTest_GetAndUpdateCheckTermination_Test *this)

{
  bool bVar1;
  char *pcVar2;
  longlong *plVar3;
  char *in_R9;
  AssertHelper local_358;
  Message local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__3;
  StatusOr<long_long> check_termination_1;
  AssertHelper local_2b8;
  Message local_2b0;
  Status local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__2;
  Message local_280;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__1;
  StatusOr<long_long> check_termination;
  Message local_200;
  OsqpExitCode local_1f8;
  OsqpExitCode local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0 [3];
  OsqpInstance local_198;
  Status local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  OsqpSolver solver;
  OsqpSettings settings;
  OsqpTest_GetAndUpdateCheckTermination_Test *this_local;
  
  OsqpSettings::OsqpSettings((OsqpSettings *)&solver);
  OsqpSolver::OsqpSolver((OsqpSolver *)&gtest_ar_.message_);
  GetToyProblem();
  OsqpSolver::Init((OsqpSolver *)&local_d8,(OsqpInstance *)&gtest_ar_.message_,
                   (OsqpSettings *)&local_198);
  local_c9 = absl::Status::ok(&local_d8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  absl::Status::~Status(&local_d8);
  OsqpInstance::~OsqpInstance(&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)local_c8,
               (AssertionResult *)"solver.Init(GetToyProblem(), settings).ok()","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x355,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    testing::Message::~Message(local_1b0);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_1f4 = OsqpSolver::Solve((OsqpSolver *)&gtest_ar_.message_);
    local_1f8 = kOptimal;
    testing::internal::EqHelper::Compare<osqp::OsqpExitCode,_osqp::OsqpExitCode,_nullptr>
              ((EqHelper *)local_1f0,"solver.Solve()","OsqpExitCode::kOptimal",&local_1f4,&local_1f8
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&check_termination.super_StatusOrData<long_long>.field_1,
                 kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0x356,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&check_termination.super_StatusOrData<long_long>.field_1,&local_200
                );
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&check_termination.super_StatusOrData<long_long>.field_1);
      testing::Message::~Message(&local_200);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      OsqpSolver::GetCheckTermination((OsqpSolver *)&gtest_ar__1.message_);
      local_229 = absl::StatusOr<long_long>::ok((StatusOr<long_long> *)&gtest_ar__1.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_228,&local_229,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_228,
                   (AssertionResult *)"check_termination.ok()","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_240,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x35a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_240,&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_240);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_238);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        plVar3 = absl::StatusOr<long_long>::operator*((StatusOr<long_long> *)&gtest_ar__1.message_);
        local_274 = 0xc;
        testing::internal::EqHelper::Compare<long_long,_int,_nullptr>
                  ((EqHelper *)local_270,"*check_termination","12",plVar3,&local_274);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
        if (!bVar1) {
          testing::Message::Message(&local_280);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x35b,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2.message_,&local_280);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_280);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
      absl::StatusOr<long_long>::~StatusOr((StatusOr<long_long> *)&gtest_ar__1.message_);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        OsqpSolver::UpdateCheckTermination((OsqpSolver *)&local_2a8,(c_int)&gtest_ar_.message_);
        local_299 = absl::Status::ok(&local_2a8);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_298,&local_299,(type *)0x0);
        absl::Status::~Status(&local_2a8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
        if (!bVar1) {
          testing::Message::Message(&local_2b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&check_termination_1.super_StatusOrData<long_long>.field_1,
                     (internal *)local_298,
                     (AssertionResult *)"solver.UpdateCheckTermination(13).ok()","false","true",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x35e,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_2b8);
          std::__cxx11::string::~string
                    ((string *)&check_termination_1.super_StatusOrData<long_long>.field_1);
          testing::Message::~Message(&local_2b0);
        }
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
        if (gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          OsqpSolver::GetCheckTermination((OsqpSolver *)&gtest_ar__3.message_);
          local_2f9 = absl::StatusOr<long_long>::ok((StatusOr<long_long> *)&gtest_ar__3.message_);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
          if (!bVar1) {
            testing::Message::Message(&local_308);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_2.message_,(internal *)local_2f8,
                       (AssertionResult *)"check_termination.ok()","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_310,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                       ,0x361,pcVar2);
            testing::internal::AssertHelper::operator=(&local_310,&local_308);
            testing::internal::AssertHelper::~AssertHelper(&local_310);
            std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_308);
          }
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            plVar3 = absl::StatusOr<long_long>::operator*
                               ((StatusOr<long_long> *)&gtest_ar__3.message_);
            local_344 = 0xd;
            testing::internal::EqHelper::Compare<long_long,_int,_nullptr>
                      ((EqHelper *)local_340,"*check_termination","13",plVar3,&local_344);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
            if (!bVar1) {
              testing::Message::Message(&local_350);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
              testing::internal::AssertHelper::AssertHelper
                        (&local_358,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                         ,0x362,pcVar2);
              testing::internal::AssertHelper::operator=(&local_358,&local_350);
              testing::internal::AssertHelper::~AssertHelper(&local_358);
              testing::Message::~Message(&local_350);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
          absl::StatusOr<long_long>::~StatusOr((StatusOr<long_long> *)&gtest_ar__3.message_);
          if (gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
  }
  OsqpSolver::~OsqpSolver((OsqpSolver *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateCheckTermination) {
  OsqpSettings settings;
  settings.check_termination = 12;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto check_termination = solver.GetCheckTermination();
    ASSERT_TRUE(check_termination.ok());
    EXPECT_EQ(*check_termination, 12);
  }

  ASSERT_TRUE(solver.UpdateCheckTermination(13).ok());
  {
    const auto check_termination = solver.GetCheckTermination();
    ASSERT_TRUE(check_termination.ok());
    EXPECT_EQ(*check_termination, 13);
  }
}